

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O0

Page * __thiscall QToolBoxPrivate::page(QToolBoxPrivate *this,QObject *widget)

{
  bool bVar1;
  pointer pPVar2;
  QWidget *in_RSI;
  long in_FS_OFFSET;
  unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *page;
  PageList *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  __normal_iterator<const_std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
  *in_stack_ffffffffffffffb0;
  pointer local_20;
  __normal_iterator<const_std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
  local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == (QWidget *)0x0) {
    local_20 = (pointer)0x0;
  }
  else {
    local_10._M_current =
         (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
         &DAT_aaaaaaaaaaaaaaaa;
    local_10._M_current =
         (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
         std::
         vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
         ::begin(in_stack_ffffffffffffffb0);
    std::
    vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
    ::end(in_stack_ffffffffffffffb0);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
                          *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
      ::operator*(&local_10);
      pPVar2 = std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>::
               operator->((unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
                           *)0x702362);
      if (pPVar2->widget == in_RSI) {
        local_20 = std::
                   unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>::
                   get((unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
                        *)0x702377);
        goto LAB_00702395;
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
      ::operator++(&local_10);
    }
    local_20 = (pointer)0x0;
  }
LAB_00702395:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

const QToolBoxPrivate::Page *QToolBoxPrivate::page(const QObject *widget) const
{
    if (!widget)
        return nullptr;

    for (const auto &page : pageList) {
        if (page->widget == widget)
            return page.get();
    }
    return nullptr;
}